

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O2

int __thiscall
zmq::ipc_listener_t::accept(ipc_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *errmsg_;
  uint *puVar4;
  uint uVar5;
  uint __errnum;
  
  iVar2 = (this->super_stream_listener_base_t)._s;
  if (iVar2 == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
            ,0x130);
    fflush(_stderr);
    zmq_abort("_s != retired_fd");
    iVar2 = (this->super_stream_listener_base_t)._s;
  }
  iVar2 = accept4(iVar2,(sockaddr *)0x0,(socklen_t *)0x0,0x80000);
  if (iVar2 == -1) {
    puVar4 = (uint *)__errno_location();
    __errnum = *puVar4;
    if ((__errnum < 0x18) && ((0x800810U >> (__errnum & 0x1f) & 1) != 0)) {
      return -1;
    }
    if (__errnum == 0x47) {
      return -1;
    }
    if (__errnum == 0x67) {
      return -1;
    }
    uVar5 = 0x147;
  }
  else {
    make_socket_noninheritable(iVar2);
    bVar1 = filter(this,iVar2);
    if (bVar1) {
      iVar3 = set_nosigpipe(iVar2);
      if (iVar3 == 0) {
        return iVar2;
      }
      iVar2 = ::close(iVar2);
      if (iVar2 == 0) {
        return -1;
      }
      uVar5 = 0x15d;
    }
    else {
      iVar2 = ::close(iVar2);
      if (iVar2 == 0) {
        return -1;
      }
      uVar5 = 0x152;
    }
    puVar4 = (uint *)__errno_location();
    __errnum = *puVar4;
  }
  errmsg_ = strerror(__errnum);
  fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ipc_listener.cpp"
          ,(ulong)uVar5);
  fflush(_stderr);
  zmq_abort(errmsg_);
  return -1;
}

Assistant:

zmq::fd_t zmq::ipc_listener_t::accept ()
{
    //  Accept one connection and deal with different failure modes.
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    zmq_assert (_s != retired_fd);
#if defined ZMQ_HAVE_SOCK_CLOEXEC && defined HAVE_ACCEPT4
    fd_t sock = ::accept4 (_s, NULL, NULL, SOCK_CLOEXEC);
#else
    struct sockaddr_storage ss;
    memset (&ss, 0, sizeof (ss));
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int ss_len = sizeof (ss);
#else
    socklen_t ss_len = sizeof (ss);
#endif

    const fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif
    if (sock == retired_fd) {
#if defined ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error == WSAEWOULDBLOCK || last_error == WSAECONNRESET
                    || last_error == WSAEMFILE || last_error == WSAENOBUFS);
#else
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENFILE);
#endif
        return retired_fd;
    }

    make_socket_noninheritable (sock);

    // IPC accept() filters
#if defined ZMQ_HAVE_SO_PEERCRED || defined ZMQ_HAVE_LOCAL_PEERCRED
    if (!filter (sock)) {
        int rc = ::close (sock);
        errno_assert (rc == 0);
        return retired_fd;
    }
#endif

    if (zmq::set_nosigpipe (sock)) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (sock);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = ::close (sock);
        errno_assert (rc == 0);
#endif
        return retired_fd;
    }

    return sock;
}